

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O1

int align_byte_sequence(rtr_bgpsec *data,stream *s,align_type type)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  uint uVar6;
  rtr_signature_seg *prVar7;
  uint uVar8;
  rtr_secure_path_seg *prVar9;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = data->target_as;
  *(uint *)(s->stream + s->w_head) =
       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  s->w_head = s->w_head + 4;
  prVar7 = (rtr_signature_seg *)&data->sigs;
  if (type == VALIDATION) {
    prVar7 = *(rtr_signature_seg **)prVar7;
  }
  prVar9 = data->path;
  if (prVar9 != (rtr_secure_path_seg *)0x0) {
    prVar7 = prVar7->next;
    do {
      if (prVar7 == (rtr_signature_seg *)0x0) {
        prVar7 = (rtr_signature_seg *)0x0;
      }
      else {
        uVar1 = prVar7->sig_len;
        puVar4 = s->stream;
        uVar2 = s->w_head;
        *(undefined4 *)(puVar4 + (ulong)uVar2 + 0x10) = *(undefined4 *)(prVar7->ski + 0x10);
        uVar5 = *(undefined8 *)(prVar7->ski + 8);
        puVar4 = puVar4 + uVar2;
        *(undefined8 *)puVar4 = *(undefined8 *)prVar7->ski;
        *(undefined8 *)(puVar4 + 8) = uVar5;
        uVar8 = *(int *)&s->w_head + 0x14;
        s->w_head = (uint16_t)uVar8;
        *(ushort *)(s->stream + (uVar8 & 0xffff)) = uVar1 << 8 | uVar1 >> 8;
        uVar8 = *(int *)&s->w_head + 2;
        s->w_head = (uint16_t)uVar8;
        uVar1 = prVar7->sig_len;
        memcpy(s->stream + (uVar8 & 0xffff),prVar7->signature,(ulong)uVar1);
        s->w_head = s->w_head + uVar1;
        prVar7 = prVar7->next;
      }
      s->stream[s->w_head] = prVar9->pcount;
      uVar8 = *(int *)&s->w_head + 1;
      s->w_head = (uint16_t)uVar8;
      s->stream[uVar8 & 0xffff] = prVar9->flags;
      uVar6 = *(int *)&s->w_head + 1;
      s->w_head = (uint16_t)uVar6;
      uVar8 = prVar9->asn;
      *(uint *)(s->stream + (uVar6 & 0xffff)) =
           uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      s->w_head = s->w_head + 4;
      prVar9 = prVar9->next;
    } while (prVar9 != (rtr_secure_path_seg *)0x0);
  }
  s->stream[s->w_head] = data->alg;
  uVar8 = *(int *)&s->w_head + 1;
  s->w_head = (uint16_t)uVar8;
  *(uint16_t *)(s->stream + (uVar8 & 0xffff)) = data->afi << 8 | data->afi >> 8;
  uVar8 = *(int *)&s->w_head + 2;
  s->w_head = (uint16_t)uVar8;
  s->stream[uVar8 & 0xffff] = data->safi;
  uVar8 = *(int *)&s->w_head + 1;
  s->w_head = (uint16_t)uVar8;
  s->stream[uVar8 & 0xffff] = data->nlri->nlri_len;
  uVar8 = *(int *)&s->w_head + 1;
  s->w_head = (uint16_t)uVar8;
  uVar6 = data->nlri->nlri_len + 7 >> 3;
  memcpy(s->stream + (uVar8 & 0xffff),data->nlri->nlri,(ulong)uVar6);
  s->w_head = s->w_head + (short)uVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int align_byte_sequence(const struct rtr_bgpsec *data, struct stream *s, enum align_type type)
{
	/* Variables used for network-to-host-order transformation. */
	uint32_t asn = 0;
	uint16_t afi = 0;

	/* Temp secure path and signature segments to prevent any
	 * alteration of the original data.
	 */
	struct rtr_secure_path_seg *tmp_sec = NULL;
	struct rtr_signature_seg *tmp_sig = NULL;

	/* The data alignment begins here, starting with the target ASN. */
	asn = htonl(data->target_as);
	write_stream(s, &asn, sizeof(asn));

	/* Depending on whether we are dealing with alignment for validation
	 * or signing, the first signature segment is skipped.
	 */
	if (type == VALIDATION)
		tmp_sig = data->sigs->next;
	else
		tmp_sig = data->sigs;

	tmp_sec = data->path;

	while (tmp_sec) {
		if (tmp_sig) {
			uint16_t sig_len = htons(tmp_sig->sig_len);

			/* Write the signature segment data to stream. */
			write_stream(s, tmp_sig->ski, SKI_SIZE);
			write_stream(s, &sig_len, sizeof(sig_len));
			write_stream(s, tmp_sig->signature, tmp_sig->sig_len);

			tmp_sig = tmp_sig->next;
		}

		/* Write the secure path segment data to stream. */
		write_stream(s, (uint8_t *)&tmp_sec->pcount, 1);
		write_stream(s, (uint8_t *)&tmp_sec->flags, 1);

		asn = htonl(tmp_sec->asn);
		write_stream(s, &asn, sizeof(asn));
		tmp_sec = tmp_sec->next;
	}

	/* Write the rest of the data to stream. */
	write_stream(s, (uint8_t *)&data->alg, 1);

	afi = htons(data->afi);
	write_stream(s, &afi, sizeof(afi));

	write_stream(s, (uint8_t *)&data->safi, 1);
	write_stream(s, (uint8_t *)&data->nlri->nlri_len, 1);

	/* Write the NLRI to stream */
	write_stream(s, data->nlri->nlri, NLRI_BYTE_LEN(data));

	return RTR_BGPSEC_SUCCESS;
}